

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  pthread_mutex_t *__mutex;
  char *__s;
  exr_result_t eVar1;
  uint uVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  size_t sVar3;
  exr_context_t nonc;
  long lVar4;
  ulong uVar5;
  exr_attribute_list_t *list;
  bool bVar6;
  bool bVar7;
  exr_attribute_t *attr;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar8;
  exr_attribute_t *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 0x15;
LAB_00123bbb:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar1);
    return eVar1;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 8;
    goto LAB_00123bbb;
  }
  if (size < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,3,"Invalid size (%d) for string vector \'%s\'",(ulong)(uint)size,name,
                       ctxt->print_error);
    return eVar1;
  }
  if (val == (char **)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,3,"No input string values for setting \'%s\', type \'stringvector\'",
                       name,ctxt->print_error);
    return eVar1;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_50);
  if (eVar1 != 0) {
    if (eVar1 == 0xf) {
      if (ctxt->mode != '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return 0xf;
      }
      eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,&local_50);
      if (eVar1 == 0) {
        eVar1 = exr_attr_string_vector_init(ctxt,(local_50->field_6).stringvector,size);
      }
      if (size != 0 && eVar1 == 0) {
        uVar5 = 0;
        do {
          eVar1 = exr_attr_string_vector_set_entry
                            (ctxt,(local_50->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
          if (eVar1 != 0) break;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (uint)size);
      }
    }
    goto LAB_00123f49;
  }
  if (local_50->type != EXR_ATTR_STRING_VECTOR) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,0x10,
                       "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'",name,
                       local_50->type_name);
    return eVar1;
  }
  if (((((local_50->field_6).box2i)->min).x == size) && (0 < (((local_50->field_6).box2i)->min).y))
  {
    bVar6 = size == 0;
    if (ctxt->mode != '\x01') {
      if (size == 0) {
        eVar1 = 0;
      }
      else {
        local_38 = (ulong)(uint)size;
        lVar4 = 0;
        uVar5 = 0;
        do {
          __s = val[uVar5];
          local_48 = lVar4;
          local_40 = uVar5;
          if (__s == (char *)0x0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            uVar2 = (*ctxt->print_error)(ctxt,3,"\'%s\' received NULL string in string vector",name)
            ;
            eVar1 = 0;
            list = (exr_attribute_list_t *)(ulong)uVar2;
            bVar7 = false;
            uVar5 = local_40;
          }
          else {
            sVar3 = strlen(__s);
            uVar5 = local_40;
            uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
            bVar7 = sVar3 != (long)*(int *)((long)&((local_50->field_6).stringvector)->strings->
                                                   length + local_48);
            if (bVar7) {
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              uVar5 = local_40;
              in_stack_ffffffffffffff98 = CONCAT44(uVar8,(int32_t)sVar3);
              uVar2 = (*ctxt->print_error)
                                (ctxt,3,
                                 "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
                                 ,name,local_40 & 0xffffffff,
                                 (ulong)*(uint *)(((local_50->field_6).chlist)->entries->reserved +
                                                 local_48 + -0x15),in_stack_ffffffffffffff98);
              eVar1 = 0;
              list = (exr_attribute_list_t *)(ulong)uVar2;
            }
            else {
              eVar1 = exr_attr_string_vector_set_entry_with_length
                                (ctxt,(local_50->field_6).stringvector,(int32_t)local_40,__s,
                                 (int32_t)sVar3);
            }
            bVar7 = !bVar7;
          }
          if (!bVar7) break;
          uVar5 = uVar5 + 1;
          bVar6 = local_38 <= uVar5 || eVar1 != 0;
          lVar4 = local_48 + 0x10;
        } while (local_38 > uVar5 && eVar1 == 0);
      }
      if (!bVar6) {
        return (exr_result_t)list;
      }
      goto LAB_00123f49;
    }
    if (size != 0) {
      uVar5 = 0;
      do {
        eVar1 = exr_attr_string_vector_set_entry
                          (ctxt,(local_50->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
        if (eVar1 != 0) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (uint)size);
      goto LAB_00123f49;
    }
  }
  else {
    if (ctxt->mode != '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x14,
                         "Existing string vector \'%s\' has %d strings, but given %d, unable to change"
                         ,name,(ulong)((local_50->field_6).preview)->width,(ulong)(uint)size);
      return eVar1;
    }
    if (size != 0) {
      uVar5 = 0;
      do {
        eVar1 = exr_attr_string_vector_set_entry
                          (ctxt,(local_50->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
        if (eVar1 != 0) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (uint)size);
      goto LAB_00123f49;
    }
  }
  eVar1 = 0;
LAB_00123f49:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE) return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (ctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}